

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O0

void send_msg(int sock)

{
  bool bVar1;
  void *__buf;
  long lVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30 [8];
  string name_msg;
  int sock_local;
  
  while( true ) {
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&std::cin,(string *)msg_abi_cxx11_);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            msg_abi_cxx11_,"Quit");
    if (bVar1) break;
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            msg_abi_cxx11_,"quit");
    if (bVar1) break;
    std::operator+(local_50,name_abi_cxx11_);
    std::operator+(local_30,local_50);
    std::__cxx11::string::~string((string *)local_50);
    __buf = (void *)std::__cxx11::string::c_str();
    lVar2 = std::__cxx11::string::length();
    send(sock,__buf,lVar2 + 1,0);
    std::__cxx11::string::~string((string *)local_30);
  }
  close(sock);
  exit(0);
}

Assistant:

void send_msg(int sock){
    while(1){
        getline(std::cin, msg);
        if (msg == "Quit"|| msg == "quit"){
            close(sock);
            exit(0);
        }
        // 生成消息格式（[name] massage）
        std::string name_msg = name + " " + msg;
        send(sock, name_msg.c_str(), name_msg.length() + 1, 0);
    }
}